

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec4 *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  TextureChannelClass TVar10;
  int x0_00;
  int x1_00;
  int y0_00;
  int y1_00;
  int z;
  int z_00;
  TextureFormat *pTVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float x;
  float y;
  float local_188;
  float local_184;
  Vector<float,_2> local_150;
  Vector<float,_2> local_148;
  Vector<float,_2> local_140;
  undefined1 local_138 [8];
  ColorQuad quad1;
  ColorQuad quad0;
  float maxC;
  float minC;
  float maxB;
  float minB;
  float maxA;
  float minA;
  int z1;
  int z0;
  int y1;
  int y0;
  int x1;
  int x0;
  int i;
  int j;
  int k;
  float searchStep;
  TextureChannelClass texClass;
  int d;
  int h;
  int w;
  int maxK;
  int minK;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 wBounds;
  Vec2 vBounds;
  Vec2 uBounds;
  Vec4 *result_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  fVar12 = Vector<float,_3>::x(coord);
  iVar3 = Vector<int,_3>::x(&prec->coordBits);
  iVar4 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar1 & 1),iVar2,fVar12,iVar3,iVar4);
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getHeight(level);
  fVar12 = Vector<float,_3>::y(coord);
  iVar3 = Vector<int,_3>::y(&prec->coordBits);
  iVar4 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&wBounds,(bool)(bVar1 & 1),iVar2,fVar12,iVar3,iVar4);
  bVar1 = sampler->normalizedCoords;
  iVar2 = ConstPixelBufferAccess::getDepth(level);
  fVar12 = Vector<float,_3>::z(coord);
  iVar3 = Vector<int,_3>::z(&prec->coordBits);
  iVar4 = Vector<int,_3>::z(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar1 & 1),iVar2,fVar12,iVar3,iVar4);
  fVar12 = Vector<float,_2>::x(&vBounds);
  dVar5 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::x(&wBounds);
  dVar7 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y(&wBounds);
  dVar8 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  i = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar9 = deFloorFloatToInt32(fVar12 - 0.5);
  iVar2 = ConstPixelBufferAccess::getWidth(level);
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  iVar4 = ConstPixelBufferAccess::getDepth(level);
  pTVar11 = ConstPixelBufferAccess::getFormat(level);
  TVar10 = getTextureChannelClass(pTVar11->type);
  if (TVar10 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_184 = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar10 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_188 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_188 = 0.0;
    }
    local_184 = local_188;
  }
  j = (int)local_184;
  do {
    x0 = dVar7;
    if (dVar9 < i) {
      return false;
    }
    for (; x1 = dVar5, x0 <= dVar8; x0 = x0 + 1) {
      for (; x1 <= dVar6; x1 = x1 + 1) {
        x0_00 = TexVerifierUtil::wrap(sampler->wrapS,x1,iVar2);
        x1_00 = TexVerifierUtil::wrap(sampler->wrapS,x1 + 1,iVar2);
        y0_00 = TexVerifierUtil::wrap(sampler->wrapT,x0,iVar3);
        y1_00 = TexVerifierUtil::wrap(sampler->wrapT,x0 + 1,iVar3);
        z = TexVerifierUtil::wrap(sampler->wrapR,i,iVar4);
        z_00 = TexVerifierUtil::wrap(sampler->wrapR,i + 1,iVar4);
        fVar12 = Vector<float,_2>::x(&vBounds);
        fVar12 = de::clamp<float>((fVar12 - 0.5) - (float)x1,0.0,1.0);
        fVar13 = Vector<float,_2>::y(&vBounds);
        fVar13 = de::clamp<float>((fVar13 - 0.5) - (float)x1,0.0,1.0);
        fVar14 = Vector<float,_2>::x(&wBounds);
        fVar14 = de::clamp<float>((fVar14 - 0.5) - (float)x0,0.0,1.0);
        fVar15 = Vector<float,_2>::y(&wBounds);
        fVar15 = de::clamp<float>((fVar15 - 0.5) - (float)x0,0.0,1.0);
        fVar16 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
        fVar16 = de::clamp<float>((fVar16 - 0.5) - (float)i,0.0,1.0);
        fVar17 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
        fVar17 = de::clamp<float>((fVar17 - 0.5) - (float)i,0.0,1.0);
        ColorQuad::ColorQuad((ColorQuad *)(quad1.p11.m_data + 2));
        ColorQuad::ColorQuad((ColorQuad *)local_138);
        lookupQuad((ColorQuad *)(quad1.p11.m_data + 2),level,sampler,x0_00,x1_00,y0_00,y1_00,z);
        lookupQuad((ColorQuad *)local_138,level,sampler,x0_00,x1_00,y0_00,y1_00,z_00);
        if (TVar10 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          x = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)(quad1.p11.m_data + 2));
          y = computeBilinearSearchStepFromFloatQuad(prec,(ColorQuad *)local_138);
          j = (int)de::min<float>(x,y);
        }
        Vector<float,_2>::Vector(&local_140,fVar12,fVar13);
        Vector<float,_2>::Vector(&local_148,fVar14,fVar15);
        Vector<float,_2>::Vector(&local_150,fVar16,fVar17);
        bVar1 = isTrilinearRangeValid
                          (prec,(ColorQuad *)(quad1.p11.m_data + 2),(ColorQuad *)local_138,
                           &local_140,&local_148,&local_150,(float)j,result);
        if (bVar1) {
          return true;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
									   const Sampler&						sampler,
									   const LookupPrecision&				prec,
									   const Vec3&							coord,
									   const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					wBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getDepth(),	coord.z(), prec.coordBits.z(), prec.uvwBits.z());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int					minJ			= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int					maxJ			= deFloorFloatToInt32(vBounds.y()-0.5f);
	const int					minK			= deFloorFloatToInt32(wBounds.x()-0.5f);
	const int					maxK			= deFloorFloatToInt32(wBounds.y()-0.5f);

	const int					w				= level.getWidth();
	const int					h				= level.getHeight();
	const int					d				= level.getDepth();

	const TextureChannelClass	texClass		= getTextureChannelClass(level.getFormat().type);
	float						searchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int k = minK; k <= maxK; k++)
	{
		for (int j = minJ; j <= maxJ; j++)
		{
			for (int i = minI; i <= maxI; i++)
			{
				// Wrapped coordinates
				const int	x0		= wrap(sampler.wrapS, i  , w);
				const int	x1		= wrap(sampler.wrapS, i+1, w);
				const int	y0		= wrap(sampler.wrapT, j  , h);
				const int	y1		= wrap(sampler.wrapT, j+1, h);
				const int	z0		= wrap(sampler.wrapR, k  , d);
				const int	z1		= wrap(sampler.wrapR, k+1, d);

				// Bounds for filtering factors
				const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
				const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
				const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
				const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);
				const float	minC	= de::clamp((wBounds.x()-0.5f)-float(k), 0.0f, 1.0f);
				const float	maxC	= de::clamp((wBounds.y()-0.5f)-float(k), 0.0f, 1.0f);

				ColorQuad quad0, quad1;
				lookupQuad(quad0, level, sampler, x0, x1, y0, y1, z0);
				lookupQuad(quad1, level, sampler, x0, x1, y0, y1, z1);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep = de::min(computeBilinearSearchStepFromFloatQuad(prec, quad0), computeBilinearSearchStepFromFloatQuad(prec, quad1));

				if (isTrilinearRangeValid(prec, quad0, quad1, Vec2(minA, maxA), Vec2(minB, maxB), Vec2(minC, maxC), searchStep, result))
					return true;
			}
		}
	}

	return false;
}